

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfa_extract.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  byte bVar2;
  value_type *pvVar3;
  pointer this;
  vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
  *this_00;
  size_type sVar4;
  path *local_d0;
  ulong local_b8;
  size_type i_1;
  anon_class_16_2_18a95ac3 write_entry;
  undefined1 local_98 [8];
  path output_dir;
  undefined1 local_60 [8];
  unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_> hfa;
  shared_ptr<mg::fs::MappedFile> hfa_data;
  path *ppStack_28;
  int i;
  char *output_path;
  char *input_basename;
  char **argv_local;
  int argc_local;
  
  output_path = (char *)0x0;
  ppStack_28 = (path *)0x0;
  for (hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       ._4_4_ = 1;
      hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ < argc;
      hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ + 1) {
    if (output_path == (char *)0x0) {
      output_path = argv[hfa_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi._4_4_];
    }
    else {
      if (ppStack_28 != (path *)0x0) {
        usage(*argv);
        return -1;
      }
      ppStack_28 = (path *)argv[hfa_data.
                                super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._4_4_];
    }
  }
  if (output_path != (char *)0x0) {
    mg::fs::MappedFile::open((char *)&stack0xffffffffffffffb8,(int)output_path);
    std::shared_ptr<mg::fs::MappedFile>::
    shared_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>,void>
              ((shared_ptr<mg::fs::MappedFile> *)&stack0xffffffffffffffc0,
               (unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
               &stack0xffffffffffffffb8);
    std::unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_>::~unique_ptr
              ((unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
               &stack0xffffffffffffffb8);
    bVar1 = std::operator==((shared_ptr<mg::fs::MappedFile> *)&stack0xffffffffffffffc0,
                            (nullptr_t)0x0);
    if (bVar1) {
      argv_local._4_4_ = -1;
      hfa._M_t.super___uniq_ptr_impl<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_>
      ._M_t.super__Tuple_impl<0UL,_mg::data::MappedHfa_*,_std::default_delete<mg::data::MappedHfa>_>
      .super__Head_base<0UL,_mg::data::MappedHfa_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      std::shared_ptr<mg::fs::MappedFile>::shared_ptr
                ((shared_ptr<mg::fs::MappedFile> *)&output_dir._M_cmpts,
                 (shared_ptr<mg::fs::MappedFile> *)&stack0xffffffffffffffc0);
      mg::data::MappedHfa::parse
                ((MappedHfa *)local_60,(shared_ptr<mg::fs::MappedFile> *)&output_dir._M_cmpts);
      std::shared_ptr<mg::fs::MappedFile>::~shared_ptr
                ((shared_ptr<mg::fs::MappedFile> *)&output_dir._M_cmpts);
      bVar1 = std::operator==((unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_>
                               *)local_60,(nullptr_t)0x0);
      if (bVar1) {
        argv_local._4_4_ = -1;
        hfa._M_t.
        super___uniq_ptr_impl<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_>._M_t.
        super__Tuple_impl<0UL,_mg::data::MappedHfa_*,_std::default_delete<mg::data::MappedHfa>_>.
        super__Head_base<0UL,_mg::data::MappedHfa_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        if (ppStack_28 == (path *)0x0) {
          local_d0 = (path *)0x110020;
        }
        else {
          local_d0 = ppStack_28;
        }
        write_entry.output_dir = local_d0;
        std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                  ((path *)local_98,(char **)&write_entry.output_dir,auto_format);
        bVar1 = std::filesystem::exists((path *)local_98);
        if ((bVar1) ||
           (bVar2 = std::filesystem::create_directories((path *)local_98), __stream = _stderr,
           (bVar2 & 1) != 0)) {
          i_1 = (size_type)local_60;
          write_entry.hfa =
               (unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_> *)
               local_98;
          local_b8 = 0;
          while( true ) {
            this = std::unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_>::
                   operator->((unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_>
                               *)local_60);
            this_00 = mg::data::MappedHfa::entries(this);
            sVar4 = std::
                    vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                    ::size(this_00);
            if (sVar4 <= local_b8) break;
            main::anon_class_16_2_18a95ac3::operator()
                      ((anon_class_16_2_18a95ac3 *)&i_1,(uint)local_b8);
            local_b8 = local_b8 + 1;
          }
          argv_local._4_4_ = 0;
        }
        else {
          pvVar3 = std::filesystem::__cxx11::path::c_str((path *)local_98);
          fprintf(__stream,"Failed to create output path \'%s\'\n",pvVar3);
          argv_local._4_4_ = -1;
        }
        hfa._M_t.
        super___uniq_ptr_impl<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_>._M_t.
        super__Tuple_impl<0UL,_mg::data::MappedHfa_*,_std::default_delete<mg::data::MappedHfa>_>.
        super__Head_base<0UL,_mg::data::MappedHfa_*,_false>._M_head_impl._0_4_ = 1;
        std::filesystem::__cxx11::path::~path((path *)local_98);
      }
      std::unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_>::~unique_ptr
                ((unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_> *)
                 local_60);
    }
    std::shared_ptr<mg::fs::MappedFile>::~shared_ptr
              ((shared_ptr<mg::fs::MappedFile> *)&stack0xffffffffffffffc0);
    return argv_local._4_4_;
  }
  usage(*argv);
  return -1;
}

Assistant:

int main(int argc, char **argv) {
  // Parse args
  const char *input_basename = nullptr;
  const char *output_path = nullptr;
  for (int i = 1; i < argc; i++) {
    // Basename?
    if (input_basename == nullptr) {
      input_basename = argv[i];
      continue;
    }

    // Output dir?
    if (output_path == nullptr) {
      output_path = argv[i];
      continue;
    }

    // Invalid state
    usage(argv[0]);
    return -1;
  }

  // Check args are OK
  if (input_basename == nullptr) {
    usage(argv[0]);
    return -1;
  }

  // Map the file
  std::shared_ptr<mg::fs::MappedFile> hfa_data =
      mg::fs::MappedFile::open(input_basename);
  if (hfa_data == nullptr) {
    return -1;
  }

  // Parse the data
  auto hfa = mg::data::MappedHfa::parse(hfa_data);
  if (hfa == nullptr) {
    return -1;
  }

  // Ensure output dir exists
  std::filesystem::path output_dir = output_path ? output_path : ".";
  if (!std::filesystem::exists(output_dir) &&
      !std::filesystem::create_directories(output_dir)) {
    fprintf(stderr, "Failed to create output path '%s'\n", output_dir.c_str());
    return -1;
  }

  // Utility method to write an index to an output file
  auto write_entry = [&](unsigned index) -> int {
    auto entry_data = hfa->entry_data(index);
    std::filesystem::path output_path = output_dir;
    output_path.append(hfa->entries().at(index).filename);
    if (!mg::fs::write_file(output_path.c_str(), entry_data)) {
      return -1;
    }
    fprintf(stderr, "Wrote %lu bytes to %s\n", entry_data.size(),
            output_path.c_str());

    return 0;
  };

  // Iterate the mrg entries and emit
  for (std::vector<std::string>::size_type i = 0; i < hfa->entries().size();
       i++) {
    write_entry(i);
  }

  return 0;
}